

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_debug_getmetatable(jit_State *J,RecordFFData *rd)

{
  GCobj *o;
  TRef TVar1;
  TRef TVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  IRRef1 IVar6;
  uint *puVar7;
  uint uVar8;
  TRef TVar9;
  bool bVar10;
  
  puVar7 = J->base;
  uVar3 = *puVar7;
  uVar8 = uVar3 & 0x1f000000;
  if (uVar8 == 0xb000000) {
    IVar6 = 5;
  }
  else {
    if (uVar8 != 0xc000000) {
      uVar4 = rd->argv->it64 >> 0x2f;
      lVar5 = 0x23;
      if (0xfffffffffffffff2 < uVar4) {
        lVar5 = 0x15 - uVar4;
      }
      o = *(GCobj **)((long)J + lVar5 * 8 + -0x130);
      if (o == (GCobj *)0x0) {
        uVar3 = 0x7fff;
      }
      else {
        uVar3 = lj_ir_kgc(J,o,IRT_TAB);
        puVar7 = J->base;
      }
      *puVar7 = uVar3;
      return;
    }
    IVar6 = 0xb;
  }
  lVar5 = *(long *)((rd->argv->u64 & 0x7fffffffffff) + 0x20);
  (J->fold).ins.field_0.ot = 0x450b;
  (J->fold).ins.field_0.op1 = (IRRef1)uVar3;
  (J->fold).ins.field_0.op2 = IVar6;
  TVar1 = lj_opt_fold(J);
  bVar10 = lVar5 != 0;
  TVar9 = 0x7fff;
  if (bVar10) {
    TVar9 = TVar1;
  }
  TVar2 = lj_ir_knull(J,IRT_TAB);
  (J->fold).ins.field_0.ot = (ushort)bVar10 << 8 | 0x88b;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  lj_opt_fold(J);
  *J->base = TVar9;
  return;
}

Assistant:

static void LJ_FASTCALL recff_debug_getmetatable(jit_State *J, RecordFFData *rd)
{
  GCtab *mt;
  TRef mtref;
  TRef tr = J->base[0];
  if (tref_istab(tr)) {
    mt = tabref(tabV(&rd->argv[0])->metatable);
    mtref = emitir(IRT(IR_FLOAD, IRT_TAB), tr, IRFL_TAB_META);
  } else if (tref_isudata(tr)) {
    mt = tabref(udataV(&rd->argv[0])->metatable);
    mtref = emitir(IRT(IR_FLOAD, IRT_TAB), tr, IRFL_UDATA_META);
  } else {
    mt = tabref(basemt_obj(J2G(J), &rd->argv[0]));
    J->base[0] = mt ? lj_ir_ktab(J, mt) : TREF_NIL;
    return;
  }
  emitir(IRTG(mt ? IR_NE : IR_EQ, IRT_TAB), mtref, lj_ir_knull(J, IRT_TAB));
  J->base[0] = mt ? mtref : TREF_NIL;
}